

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ProgramUniformTests::init(ProgramUniformTests *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  deInt32 *pdVar2;
  DataType DVar3;
  AssignMethod assignMethod;
  Context *pCVar4;
  pointer pcVar5;
  long lVar6;
  pointer pUVar7;
  SharedPtrStateBase *pSVar8;
  bool bVar9;
  byte bVar10;
  CheckMethod checkMethod;
  bool bVar11;
  bool bVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  DataType DVar17;
  long lVar18;
  DataType *pDVar19;
  char *pcVar20;
  UniformCollection *pUVar21;
  long *plVar22;
  UniformCollection *pUVar23;
  TestNode *pTVar24;
  TestNode *pTVar25;
  TestNode *node;
  UniformAssignCase *pUVar26;
  ulong uVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  _func_int **pp_Var29;
  size_type *psVar30;
  char *pcVar31;
  long lVar32;
  pointer pUVar33;
  byte bVar34;
  byte bVar35;
  uint uVar36;
  UniformCollectionGroup *pUVar37;
  int shaderType;
  uint uVar38;
  deUint32 in_stack_fffffffffffffb38;
  long local_4c0;
  string nameWithMatrixType;
  string nameWithBoolType;
  string name;
  SharedPtrStateBase *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  long local_410;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection> *local_3f0;
  int local_3e8;
  ostringstream s;
  UniformCollectionGroup defaultUniformCollections [9];
  
  lVar18 = 0x1f8;
  paVar28 = &defaultUniformCollections[0].name.field_2;
  do {
    (((string *)(paVar28 + -1))->_M_dataplus)._M_p = (pointer)paVar28;
    *(size_type *)((long)paVar28 + -8) = 0;
    paVar28->_M_local_buf[0] = '\0';
    paVar28[1]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar28 + 0x18) = 0;
    paVar28[2]._M_allocated_capacity = 0;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)paVar28 + 0x38);
    lVar18 = lVar18 + -0x38;
  } while (lVar18 != 0);
  std::__cxx11::string::_M_replace
            ((ulong)defaultUniformCollections,0,
             (char *)defaultUniformCollections[0].name._M_string_length,0x1a47766);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 1),0,
             (char *)defaultUniformCollections[1].name._M_string_length,0x1b83d82);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 2),0,
             (char *)defaultUniformCollections[2].name._M_string_length,0x1bc805f);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 3),0,
             (char *)defaultUniformCollections[3].name._M_string_length,0x1bc806c);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 4),0,
             (char *)defaultUniformCollections[4].name._M_string_length,0x1bc807c);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 5),0,
             (char *)defaultUniformCollections[5].name._M_string_length,0x1bc80b9);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 6),0,
             (char *)defaultUniformCollections[6].name._M_string_length,0x1bc808c);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 7),0,
             (char *)defaultUniformCollections[7].name._M_string_length,0x1bc809b);
  std::__cxx11::string::_M_replace
            ((ulong)(defaultUniformCollections + 8),0,
             (char *)defaultUniformCollections[8].name._M_string_length,0x1bc80b0);
  pDVar19 = &s_testDataTypes;
  local_4c0 = 0;
  do {
    DVar3 = *pDVar19;
    pcVar20 = glu::getDataTypeName(DVar3);
    pUVar21 = anon_unknown_1::UniformCollection::basic
                        (DVar3,glcts::fixed_sample_locations_values + 1);
    anon_unknown_1::UniformCollectionCase::UniformCollectionCase
              ((UniformCollectionCase *)&s,pcVar20,pUVar21);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
    ::push_back(&defaultUniformCollections[0].cases,(UniformCollectionCase *)&s);
    if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
      LOCK();
      piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
        (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))()
        ;
      }
      LOCK();
      piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))();
        }
        s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      }
    }
    if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    uVar27 = (ulong)DVar3;
    if (DVar3 < TYPE_BOOL_VEC2) {
      if ((0x77003801cU >> (uVar27 & 0x3f) & 1) != 0) goto LAB_0154604c;
      if ((0x888004002U >> (uVar27 & 0x3f) & 1) == 0) goto LAB_015466a2;
LAB_01546080:
      pUVar21 = anon_unknown_1::UniformCollection::basicArray
                          (DVar3,glcts::fixed_sample_locations_values + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,pcVar20,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[1].cases,(UniformCollectionCase *)&s);
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))
                    ();
        }
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
            (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))
                      ();
          }
          s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        }
      }
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
    }
    else {
LAB_015466a2:
      if (DVar3 - TYPE_BOOL_VEC2 < 3) {
LAB_0154604c:
        iVar16 = glu::getDataTypeScalarSize(DVar3);
        if (iVar16 == 4) goto LAB_01546080;
      }
      if (((int)local_4c0 == 0xc) || ((int)local_4c0 == 0x19)) goto LAB_01546080;
    }
    if ((DVar3 < TYPE_BOOL_VEC2) && ((0x888004002U >> (uVar27 & 0x3f) & 1) != 0)) {
LAB_01546152:
      DVar17 = glu::getDataTypeVector(DVar3,4);
LAB_01546162:
      glu::getDataTypeName(DVar17);
      nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&nameWithMatrixType,0x1aee929);
      plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithMatrixType);
      nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
      psVar30 = (size_type *)(plVar22 + 2);
      if ((size_type *)*plVar22 == psVar30) {
        nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
        nameWithBoolType.field_2._8_8_ = plVar22[3];
      }
      else {
        nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
        nameWithBoolType._M_dataplus._M_p = (pointer)*plVar22;
      }
      nameWithBoolType._M_string_length = plVar22[1];
      *plVar22 = (long)psVar30;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithBoolType);
      s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      pp_Var29 = (_func_int **)(plVar22 + 2);
      if ((_func_int **)*plVar22 == pp_Var29) {
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var29;
        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar22[3];
      }
      else {
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var29;
        s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)*plVar22;
      }
      s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar22[1];
      *plVar22 = (long)pp_Var29;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&s);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar30 = (size_type *)(plVar22 + 2);
      if ((size_type *)*plVar22 == psVar30) {
        name.field_2._M_allocated_capacity = *psVar30;
        name.field_2._8_8_ = plVar22[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar30;
        name._M_dataplus._M_p = (pointer)*plVar22;
      }
      name._M_string_length = plVar22[1];
      *plVar22 = (long)psVar30;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
        operator_delete(nameWithBoolType._M_dataplus._M_p,
                        nameWithBoolType.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
        operator_delete(nameWithMatrixType._M_dataplus._M_p,
                        nameWithMatrixType.field_2._M_allocated_capacity + 1);
      }
      _Var13._M_p = name._M_dataplus._M_p;
      pUVar21 = anon_unknown_1::UniformCollection::basicStruct(DVar3,DVar17,false,(char *)psVar30);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var13._M_p,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[2].cases,(UniformCollectionCase *)&s);
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))
                    ();
        }
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
            (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))
                      ();
          }
          s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        }
      }
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      _Var13._M_p = name._M_dataplus._M_p;
      pUVar21 = anon_unknown_1::UniformCollection::basicStruct(DVar3,DVar17,true,(char *)psVar30);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var13._M_p,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[4].cases,(UniformCollectionCase *)&s);
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))
                    ();
        }
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
            (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))
                      ();
          }
          s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        }
      }
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      _Var13._M_p = name._M_dataplus._M_p;
      pUVar21 = anon_unknown_1::UniformCollection::basicStruct(DVar3,DVar17,false,(char *)psVar30);
      glu::VarType::VarType
                ((VarType *)&nameWithBoolType,
                 &((pUVar21->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,3);
      glu::VarType::operator=
                (&((pUVar21->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,(VarType *)&nameWithBoolType);
      glu::VarType::~VarType((VarType *)&nameWithBoolType);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var13._M_p,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[3].cases,(value_type *)&s);
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))
                    ();
        }
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
            (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))
                      ();
          }
          s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        }
      }
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      _Var13._M_p = name._M_dataplus._M_p;
      pUVar21 = anon_unknown_1::UniformCollection::nestedArraysStructs
                          (DVar3,DVar17,glcts::fixed_sample_locations_values + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&s,_Var13._M_p,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[5].cases,(UniformCollectionCase *)&s);
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          s.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
          (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0x10))
                    ();
        }
        LOCK();
        piVar1 = (int *)(s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != 0) {
            (**(code **)(*(long *)s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ + 8))
                      ();
          }
          s.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
        }
      }
      if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
    }
    else if (((int)local_4c0 == 0x19) || ((int)local_4c0 == 0xc)) {
      if ((DVar3 < TYPE_UINT_VEC2) && ((0x88004002U >> (DVar3 & TYPE_UINT) & 1) != 0))
      goto LAB_01546152;
      DVar17 = TYPE_LAST;
      if (local_4c0 == 0x19) {
        DVar17 = TYPE_SAMPLER_CUBE;
      }
      if (local_4c0 == 0xc) {
        DVar17 = TYPE_FLOAT_MAT2;
      }
      goto LAB_01546162;
    }
    local_4c0 = local_4c0 + 1;
    pDVar19 = pDVar19 + 1;
    if (local_4c0 == 0x1b) {
      pUVar21 = (UniformCollection *)operator_new(0x30);
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar19 = &Functional::(anonymous_namespace)::UniformCollection::multipleBasic(char_const*)::
                 types;
      lVar18 = 0;
      do {
        DVar3 = *pDVar19;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((ostringstream *)&s,(int)lVar18);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar22 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x1c47ead);
        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithMatrixType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithMatrixType);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithBoolType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        pUVar23 = anon_unknown_1::UniformCollection::basic(DVar3,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar23,pUVar21);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar23);
        operator_delete(pUVar23,0x30);
        lVar18 = lVar18 + 1;
        pDVar19 = pDVar19 + 1;
      } while (lVar18 != 5);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[6].cases,(value_type *)&name);
      if (local_448 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &local_448->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          (*local_448->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &local_448->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          if (local_448 != (SharedPtrStateBase *)0x0) {
            (*local_448->_vptr_SharedPtrStateBase[1])();
          }
          local_448 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pUVar21 = (UniformCollection *)operator_new(0x30);
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar19 = &Functional::(anonymous_namespace)::UniformCollection::
                 multipleBasicArray(char_const*)::types;
      lVar18 = 0;
      do {
        DVar3 = *pDVar19;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((ostringstream *)&s,(int)lVar18);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar22 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x1c47ead);
        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithMatrixType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithMatrixType);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithBoolType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        pUVar23 = anon_unknown_1::UniformCollection::basicArray
                            (DVar3,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar23,pUVar21);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar23);
        operator_delete(pUVar23,0x30);
        lVar18 = lVar18 + 1;
        pDVar19 = pDVar19 + 1;
      } while (lVar18 != 3);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[7].cases,(value_type *)&name);
      if (local_448 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &local_448->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          (*local_448->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &local_448->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          if (local_448 != (SharedPtrStateBase *)0x0) {
            (*local_448->_vptr_SharedPtrStateBase[1])();
          }
          local_448 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      pUVar21 = (UniformCollection *)operator_new(0x30);
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar21->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar21->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar16 = 0;
      lVar18 = 0;
      do {
        DVar3 = *(DataType *)
                 ((long)&Functional::(anonymous_namespace)::UniformCollection::
                         multipleNestedArraysStructs(char_const*)::types0 + lVar18);
        DVar17 = *(DataType *)
                  ((long)&Functional::(anonymous_namespace)::UniformCollection::
                          multipleNestedArraysStructs(char_const*)::types1 + lVar18);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<(&s,iVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar22 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x1c47ead);
        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
          nameWithMatrixType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithMatrixType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithMatrixType);
        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
        psVar30 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar30) {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType.field_2._8_8_ = plVar22[3];
        }
        else {
          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar22;
        }
        nameWithBoolType._M_string_length = plVar22[1];
        *plVar22 = (long)psVar30;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        pUVar23 = anon_unknown_1::UniformCollection::nestedArraysStructs
                            (DVar3,DVar17,nameWithBoolType._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
          operator_delete(nameWithBoolType._M_dataplus._M_p,
                          nameWithBoolType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
        anon_unknown_1::UniformCollection::moveContents(pUVar23,pUVar21);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar23);
        operator_delete(pUVar23,0x30);
        lVar18 = lVar18 + 4;
        iVar16 = iVar16 + 1;
      } while (lVar18 != 0xc);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&name,(char *)0x0,pUVar21);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[8].cases,(value_type *)&name);
      if (local_448 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &local_448->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          (*local_448->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &local_448->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if ((*pdVar2 == 0) && (local_448 != (SharedPtrStateBase *)0x0)) {
          (*local_448->_vptr_SharedPtrStateBase[1])();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      bVar9 = false;
      bVar12 = true;
      checkMethod = CHECKMETHOD_GET_UNIFORM;
      do {
        pTVar24 = (TestNode *)operator_new(0x78);
        pcVar20 = (char *)0x0;
        if (bVar9) {
          pcVar20 = "by_value";
        }
        pcVar31 = (char *)0x0;
        if (bVar9) {
          pcVar31 = "Assign values by-value";
        }
        if (bVar12) {
          pcVar20 = "by_pointer";
        }
        pCVar4 = (this->super_TestCaseGroup).m_context;
        if (bVar12) {
          pcVar31 = "Assign values by-pointer";
        }
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar24,pCVar4->m_testCtx,pcVar20,pcVar31);
        pTVar24->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
        pTVar24[1]._vptr_TestNode = (_func_int **)pCVar4;
        tcu::TestNode::addChild((TestNode *)this,pTVar24);
        bVar15 = false;
        local_3f0 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                     *)0x0;
        bVar14 = true;
        do {
          bVar11 = bVar14;
          pTVar25 = (TestNode *)operator_new(0x78);
          pcVar20 = (char *)0x0;
          if (bVar15) {
            pcVar20 = "render";
          }
          pcVar31 = (char *)0x0;
          if (bVar15) {
            pcVar31 = "Verify values by rendering";
          }
          if (bVar11) {
            pcVar20 = "get_uniform";
          }
          pCVar4 = (this->super_TestCaseGroup).m_context;
          if (bVar11) {
            pcVar31 = "Verify values with glGetUniform*()";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar25,pCVar4->m_testCtx,pcVar20,pcVar31);
          pTVar25->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
          pTVar25[1]._vptr_TestNode = (_func_int **)pCVar4;
          tcu::TestNode::addChild(pTVar24,pTVar25);
          uVar27 = 0;
          do {
            bVar10 = 1;
            do {
              s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pcVar5 = defaultUniformCollections[uVar27].name._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&s,pcVar5,
                         pcVar5 + defaultUniformCollections[uVar27].name._M_string_length);
              std::__cxx11::string::append((char *)&s);
              pUVar33 = defaultUniformCollections[uVar27].cases.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0 < (int)((ulong)((long)defaultUniformCollections[uVar27].cases.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar33
                                   ) >> 4) * -0x55555555) {
                lVar18 = 0;
                node = (TestNode *)0x0;
                do {
                  name._M_dataplus._M_p = (pointer)&name.field_2;
                  lVar32 = *(long *)&pUVar33[lVar18].namePrefix._M_dataplus;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&name,lVar32,
                             pUVar33[lVar18].namePrefix._M_string_length + lVar32);
                  bVar14 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                     (pUVar33[lVar18].uniformCollection.m_ptr,
                                      glu::isDataTypeBoolOrBVec);
                  if (!bVar11) {
                    local_3e8 = 1;
                  }
                  else {
                    local_3e8 = (uint)(uVar27 < 2 && bVar14) * 2 + 1;
                  }
                  bVar15 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                     (pUVar33[lVar18].uniformCollection.m_ptr,glu::isDataTypeMatrix)
                  ;
                  if ((bVar9 & bVar15) == 0) {
                    iVar16 = 0;
                    do {
                      uVar38 = (uint)(iVar16 == 2) << 7;
                      if (iVar16 == 1) {
                        uVar38 = 0x40;
                      }
                      if (!bVar11 || (1 < uVar27 || !bVar14)) {
                        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&nameWithBoolType,name._M_dataplus._M_p,
                                   name._M_dataplus._M_p + name._M_string_length);
                      }
                      else {
                        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&__str_1,name._M_dataplus._M_p,
                                   name._M_dataplus._M_p + name._M_string_length);
                        std::__cxx11::string::append((char *)&__str_1);
                        plVar22 = (long *)std::__cxx11::string::append((char *)&__str_1);
                        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
                        psVar30 = (size_type *)(plVar22 + 2);
                        if ((size_type *)*plVar22 == psVar30) {
                          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
                          nameWithMatrixType.field_2._8_8_ = plVar22[3];
                        }
                        else {
                          nameWithMatrixType.field_2._M_allocated_capacity = *psVar30;
                          nameWithMatrixType._M_dataplus._M_p = (pointer)*plVar22;
                        }
                        nameWithMatrixType._M_string_length = plVar22[1];
                        *plVar22 = (long)psVar30;
                        plVar22[1] = 0;
                        *(undefined1 *)(plVar22 + 2) = 0;
                        plVar22 = (long *)std::__cxx11::string::append((char *)&nameWithMatrixType);
                        nameWithBoolType._M_dataplus._M_p = (pointer)&nameWithBoolType.field_2;
                        psVar30 = (size_type *)(plVar22 + 2);
                        if ((size_type *)*plVar22 == psVar30) {
                          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
                          nameWithBoolType.field_2._8_8_ = plVar22[3];
                        }
                        else {
                          nameWithBoolType.field_2._M_allocated_capacity = *psVar30;
                          nameWithBoolType._M_dataplus._M_p = (pointer)*plVar22;
                        }
                        nameWithBoolType._M_string_length = plVar22[1];
                        *plVar22 = (long)psVar30;
                        plVar22[1] = 0;
                        *(undefined1 *)(plVar22 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
                          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                          operator_delete(__str_1._M_dataplus._M_p,
                                          __str_1.field_2._M_allocated_capacity + 1);
                        }
                      }
                      bVar35 = 1;
                      bVar34 = 0;
                      do {
                        nameWithMatrixType._M_dataplus._M_p = (pointer)&nameWithMatrixType.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&nameWithMatrixType,nameWithBoolType._M_dataplus._M_p,
                                   nameWithBoolType._M_dataplus._M_p +
                                   nameWithBoolType._M_string_length);
                        std::__cxx11::string::append((char *)&nameWithMatrixType);
                        pcVar20 = (char *)0x0;
                        do {
                          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&__str_1,nameWithMatrixType._M_dataplus._M_p,
                                     nameWithMatrixType._M_dataplus._M_p +
                                     nameWithMatrixType._M_string_length);
                          std::__cxx11::string::append((char *)&__str_1);
                          if (node == (TestNode *)0x0) {
                            node = (TestNode *)operator_new(0x78);
                            pCVar4 = (this->super_TestCaseGroup).m_context;
                            tcu::TestCaseGroup::TestCaseGroup
                                      ((TestCaseGroup *)node,pCVar4->m_testCtx,
                                       (char *)s.super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream,
                                       glcts::fixed_sample_locations_values + 1);
                            node->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
                            node[1]._vptr_TestNode = (_func_int **)pCVar4;
                            tcu::TestNode::addChild(pTVar25,node);
                          }
                          pUVar26 = (UniformAssignCase *)operator_new(0xf8);
                          UniformAssignCase::UniformAssignCase
                                    (pUVar26,(this->super_TestCaseGroup).m_context,
                                     __str_1._M_dataplus._M_p,pcVar20,
                                     (CaseShaderType)&pUVar33[lVar18].uniformCollection,local_3f0,
                                     checkMethod,
                                     (uVar38 | (uint)(byte)~bVar10 << 8) + (uint)bVar34 * 4,
                                     in_stack_fffffffffffffb38);
                          tcu::TestNode::addChild(node,(TestNode *)pUVar26);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                            operator_delete(__str_1._M_dataplus._M_p,
                                            __str_1.field_2._M_allocated_capacity + 1);
                          }
                          uVar36 = (int)pcVar20 + 1;
                          pcVar20 = (char *)(ulong)uVar36;
                        } while (uVar36 != 3);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)nameWithMatrixType._M_dataplus._M_p != &nameWithMatrixType.field_2) {
                          operator_delete(nameWithMatrixType._M_dataplus._M_p,
                                          nameWithMatrixType.field_2._M_allocated_capacity + 1);
                        }
                        if ((bVar35 & bVar15) != 1) break;
                        bVar34 = 1;
                        bVar35 = 0;
                      } while (uVar27 < 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)nameWithBoolType._M_dataplus._M_p != &nameWithBoolType.field_2) {
                        operator_delete(nameWithBoolType._M_dataplus._M_p,
                                        nameWithBoolType.field_2._M_allocated_capacity + 1);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != local_3e8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)name._M_dataplus._M_p != &name.field_2) {
                    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                  }
                  lVar18 = lVar18 + 1;
                  pUVar33 = defaultUniformCollections[uVar27].cases.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar18 < (int)((ulong)((long)defaultUniformCollections[uVar27].cases.
                                                                                                            
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pUVar33) >> 4) * -0x55555555);
              }
              if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              bVar14 = (bool)(uVar27 == 1 & bVar11 & bVar10);
              bVar10 = 0;
            } while (bVar14);
            uVar27 = uVar27 + 1;
          } while (uVar27 != 9);
          local_3f0 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                       *)&DAT_00000001;
          bVar15 = true;
          bVar14 = false;
        } while (bVar11);
        checkMethod = CHECKMETHOD_RENDER;
        bVar9 = true;
        bVar14 = !bVar12;
        bVar12 = false;
        if (bVar14) {
          lVar18 = 0;
          bVar9 = true;
          do {
            bVar12 = bVar9;
            assignMethod = init::arrayAssignGroups[lVar18].arrayAssignMode;
            pcVar20 = init::arrayAssignGroups[lVar18].name;
            pcVar31 = init::arrayAssignGroups[lVar18].description;
            pTVar24 = (TestNode *)operator_new(0x78);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar24,pCVar4->m_testCtx,pcVar20,pcVar31);
            pTVar24->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
            pTVar24[1]._vptr_TestNode = (_func_int **)pCVar4;
            tcu::TestNode::addChild((TestNode *)this,pTVar24);
            lVar18 = 0;
            do {
              iVar16 = init::basicArrayCollectionGroups[lVar18];
              pTVar25 = (TestNode *)operator_new(0x78);
              pCVar4 = (this->super_TestCaseGroup).m_context;
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar25,pCVar4->m_testCtx,
                         defaultUniformCollections[iVar16].name._M_dataplus._M_p,
                         glcts::fixed_sample_locations_values + 1);
              pTVar25->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
              pTVar25[1]._vptr_TestNode = (_func_int **)pCVar4;
              tcu::TestNode::addChild(pTVar24,pTVar25);
              pUVar33 = defaultUniformCollections[iVar16].cases.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0 < (int)((ulong)((long)defaultUniformCollections[iVar16].cases.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar33
                                   ) >> 4) * -0x55555555) {
                lVar32 = 0;
                do {
                  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                       (_func_int **)
                       &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
                  lVar6 = *(long *)&pUVar33[lVar32].namePrefix._M_dataplus;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&s,lVar6,pUVar33[lVar32].namePrefix._M_string_length + lVar6)
                  ;
                  pcVar20 = (char *)0x0;
                  do {
                    name._M_dataplus._M_p = (pointer)&name.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&name,
                               s.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream,
                               s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                               (long)s.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream);
                    std::__cxx11::string::append((char *)&name);
                    pUVar26 = (UniformAssignCase *)operator_new(0xf8);
                    UniformAssignCase::UniformAssignCase
                              (pUVar26,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                               pcVar20,(int)pUVar33 + (int)lVar32 * 0x30U + 0x20,
                               (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                                *)0x0,CHECKMETHOD_GET_UNIFORM,assignMethod,in_stack_fffffffffffffb38
                              );
                    tcu::TestNode::addChild(pTVar25,(TestNode *)pUVar26);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)name._M_dataplus._M_p != &name.field_2) {
                      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                    }
                    uVar38 = (int)pcVar20 + 1;
                    pcVar20 = (char *)(ulong)uVar38;
                  } while (uVar38 != 3);
                  if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                      (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
                     ) {
                    operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,
                                    s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1)
                    ;
                  }
                  lVar32 = lVar32 + 1;
                  pUVar33 = defaultUniformCollections[iVar16].cases.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar32 < (int)((ulong)((long)defaultUniformCollections[iVar16].cases.
                                                                                                            
                                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pUVar33) >> 4) * -0x55555555);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            lVar18 = 1;
            bVar9 = false;
          } while (bVar12);
          pTVar24 = (TestNode *)operator_new(0x78);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar24,pCVar4->m_testCtx,"unused_uniforms",
                     "Test with unused uniforms");
          pTVar24->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
          pTVar24[1]._vptr_TestNode = (_func_int **)pCVar4;
          tcu::TestNode::addChild((TestNode *)this,pTVar24);
          pUVar37 = (UniformCollectionGroup *)&stack0xffffffffffffffd0;
          if (0 < (int)((ulong)((long)defaultUniformCollections[4].cases.
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)defaultUniformCollections[4].cases.
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
          {
            local_410 = 0;
            do {
              pUVar33 = defaultUniformCollections[4].cases.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pcVar5 = defaultUniformCollections[4].cases.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_410].namePrefix._M_dataplus.
                       _M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&s,pcVar5,
                         pcVar5 + defaultUniformCollections[4].cases.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start[local_410].namePrefix.
                                  _M_string_length);
              pcVar20 = (char *)0x0;
              do {
                name._M_dataplus._M_p = (pointer)&name.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&name,
                           s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                           s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                           (long)s.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream);
                std::__cxx11::string::append((char *)&name);
                pUVar26 = (UniformAssignCase *)operator_new(0xf8);
                UniformAssignCase::UniformAssignCase
                          (pUVar26,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                           pcVar20,(int)pUVar33 + (int)local_410 * 0x30 + 0x20,
                           (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                            *)0x0,CHECKMETHOD_GET_UNIFORM,0x21,in_stack_fffffffffffffb38);
                tcu::TestNode::addChild(pTVar24,(TestNode *)pUVar26);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)name._M_dataplus._M_p != &name.field_2) {
                  operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
                }
                uVar38 = (int)pcVar20 + 1;
                pcVar20 = (char *)(ulong)uVar38;
              } while (uVar38 != 3);
              if (s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                operator_delete(s.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              local_410 = local_410 + 1;
              pUVar37 = (UniformCollectionGroup *)&stack0xffffffffffffffd0;
            } while (local_410 <
                     (int)((ulong)((long)defaultUniformCollections[4].cases.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)defaultUniformCollections[4].cases.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555);
          }
          do {
            pUVar33 = pUVar37[-1].cases.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pUVar7 = pUVar37[-1].cases.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pUVar33 != pUVar7) {
              do {
                pSVar8 = (pUVar33->uniformCollection).m_state;
                if (pSVar8 != (SharedPtrStateBase *)0x0) {
                  LOCK();
                  pdVar2 = &pSVar8->strongRefCount;
                  *pdVar2 = *pdVar2 + -1;
                  UNLOCK();
                  if (*pdVar2 == 0) {
                    (pUVar33->uniformCollection).m_ptr = (UniformCollection *)0x0;
                    (*((pUVar33->uniformCollection).m_state)->_vptr_SharedPtrStateBase[2])();
                  }
                  LOCK();
                  pdVar2 = &((pUVar33->uniformCollection).m_state)->weakRefCount;
                  *pdVar2 = *pdVar2 + -1;
                  UNLOCK();
                  if (*pdVar2 == 0) {
                    pSVar8 = (pUVar33->uniformCollection).m_state;
                    if (pSVar8 != (SharedPtrStateBase *)0x0) {
                      (*pSVar8->_vptr_SharedPtrStateBase[1])();
                    }
                    (pUVar33->uniformCollection).m_state = (SharedPtrStateBase *)0x0;
                  }
                }
                pcVar5 = (pUVar33->namePrefix)._M_dataplus._M_p;
                paVar28 = &(pUVar33->namePrefix).field_2;
                if (paVar28 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar5) {
                  operator_delete(pcVar5,paVar28->_M_allocated_capacity + 1);
                }
                pUVar33 = pUVar33 + 1;
              } while (pUVar33 != pUVar7);
              pUVar33 = pUVar37[-1].cases.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            if (pUVar33 != (pointer)0x0) {
              operator_delete(pUVar33,(long)pUVar37[-1].cases.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pUVar33);
            }
            pcVar5 = pUVar37[-1].name._M_dataplus._M_p;
            paVar28 = &pUVar37[-1].name.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar5 != paVar28) {
              operator_delete(pcVar5,paVar28->_M_allocated_capacity + 1);
            }
            pUVar37 = pUVar37 + -1;
          } while (pUVar37 != defaultUniformCollections);
          return (int)defaultUniformCollections;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ProgramUniformTests::init (void)
{
	// Generate sets of UniformCollections that are used by several cases.

	enum
	{
		UNIFORMCOLLECTIONS_BASIC = 0,
		UNIFORMCOLLECTIONS_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_BASIC_STRUCT,
		UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY,
		UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT,
		UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS,

		UNIFORMCOLLECTIONS_LAST
	};

	struct UniformCollectionGroup
	{
		string							name;
		vector<UniformCollectionCase>	cases;
	} defaultUniformCollections[UNIFORMCOLLECTIONS_LAST];

	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].name							= "basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].name						= "basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].name						= "basic_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].name					= "struct_in_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].name					= "array_in_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].name			= "nested_structs_arrays";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].name					= "multiple_basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].name				= "multiple_basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].name	= "multiple_nested_structs_arrays";

	for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_testDataTypes); dataTypeNdx++)
	{
		const glu::DataType		dataType	= s_testDataTypes[dataTypeNdx];
		const char* const		typeName	= glu::getDataTypeName(dataType);

		defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basic(dataType)));

		if (glu::isDataTypeScalar(dataType)													||
			(glu::isDataTypeVector(dataType) && glu::getDataTypeScalarSize(dataType) == 4)	||
			dataType == glu::TYPE_FLOAT_MAT4												||
			dataType == glu::TYPE_SAMPLER_2D)
			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basicArray(dataType)));

		if (glu::isDataTypeScalar(dataType)		||
			dataType == glu::TYPE_FLOAT_MAT4	||
			dataType == glu::TYPE_SAMPLER_2D)
		{
			const glu::DataType		secondDataType	= glu::isDataTypeScalar(dataType)	? glu::getDataTypeVector(dataType, 4)
													: dataType == glu::TYPE_FLOAT_MAT4	? glu::TYPE_FLOAT_MAT2
													: dataType == glu::TYPE_SAMPLER_2D	? glu::TYPE_SAMPLER_CUBE
													: glu::TYPE_LAST;
			DE_ASSERT(secondDataType != glu::TYPE_LAST);
			const char* const		secondTypeName	= glu::getDataTypeName(secondDataType);
			const string			name			= string("") + typeName + "_" + secondTypeName;

			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].cases.push_back			(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, true)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::structInArray(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(name.c_str(), UniformCollection::nestedArraysStructs(dataType, secondDataType)));
		}
	}
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].cases.push_back					(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasic()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].cases.push_back				(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasicArray()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(DE_NULL, UniformCollection::multipleNestedArraysStructs()));

	// Basic by-pointer or by-value uniform assignment cases.

	for (int assignMethodI = 0; assignMethodI < (int)UniformAssignCase::ASSIGNMETHOD_LAST; assignMethodI++)
	{
		const UniformAssignCase::AssignMethod	assignMethod		= (UniformAssignCase::AssignMethod)assignMethodI;
		TestCaseGroup* const					assignMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getAssignMethodName(assignMethod), UniformAssignCase::getAssignMethodDescription(assignMethod));
		addChild(assignMethodGroup);

		for (int checkMethodI = 0; checkMethodI < (int)UniformAssignCase::CHECKMETHOD_LAST; checkMethodI++)
		{
			const UniformAssignCase::CheckMethod	checkMethod			= (UniformAssignCase::CheckMethod)checkMethodI;
			TestCaseGroup* const					checkMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getCheckMethodName(checkMethod), UniformAssignCase::getCheckMethodDescription(checkMethod));
			assignMethodGroup->addChild(checkMethodGroup);

			for (int collectionGroupNdx = 0; collectionGroupNdx < (int)UNIFORMCOLLECTIONS_LAST; collectionGroupNdx++)
			{
				const int numArrayFirstElemNameCases = checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY ? 2 : 1;

				for (int referToFirstArrayElemWithoutIndexI = 0; referToFirstArrayElemWithoutIndexI < numArrayFirstElemNameCases; referToFirstArrayElemWithoutIndexI++)
				{
					const UniformCollectionGroup&	collectionGroup			= defaultUniformCollections[collectionGroupNdx];
					const string					collectionGroupName		= collectionGroup.name + (referToFirstArrayElemWithoutIndexI == 0 ? "" : "_first_elem_without_brackets");
					TestCaseGroup*					collectionTestGroup		= DE_NULL;

					for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
					{
						const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
						const string								collName			= collectionCase.namePrefix;
						const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;
						const bool									containsBooleans	= uniformCollection->containsMatchingBasicType(glu::isDataTypeBoolOrBVec);
						const bool									varyBoolApiType		= checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && containsBooleans &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numBoolVariations	= varyBoolApiType ? 3 : 1;
						const bool									containsMatrices	= uniformCollection->containsMatchingBasicType(glu::isDataTypeMatrix);
						const bool									varyMatrixMode		= containsMatrices &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numMatVariations	= varyMatrixMode ? 2 : 1;

						if (containsMatrices && assignMethod != UniformAssignCase::ASSIGNMETHOD_POINTER)
							continue;

						for (int booleanTypeI = 0; booleanTypeI < numBoolVariations; booleanTypeI++)
						{
							const deUint32		booleanTypeFeat		= booleanTypeI == 1 ? UniformCase::FEATURE_BOOLEANAPITYPE_INT
																	: booleanTypeI == 2 ? UniformCase::FEATURE_BOOLEANAPITYPE_UINT
																	: 0;
							const char* const	booleanTypeName		= booleanTypeI == 1 ? "int"
																	: booleanTypeI == 2 ? "uint"
																	: "float";
							const string		nameWithBoolType	= varyBoolApiType ? collName + "api_" + booleanTypeName + "_" : collName;

							for (int matrixTypeI = 0; matrixTypeI < numMatVariations; matrixTypeI++)
							{
								const string nameWithMatrixType = nameWithBoolType + (matrixTypeI == 1 ? "row_major_" : "");

								for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
								{
									const string	name							= nameWithMatrixType + getCaseShaderTypeName((CaseShaderType)shaderType);
									const deUint32	arrayFirstElemNameNoIndexFeat	= referToFirstArrayElemWithoutIndexI == 0 ? 0 : UniformCase::FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX;

									// skip empty groups by creating groups on demand
									if (!collectionTestGroup)
									{
										collectionTestGroup = new TestCaseGroup(m_context, collectionGroupName.c_str(), "");
										checkMethodGroup->addChild(collectionTestGroup);
									}

									collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																						checkMethod, assignMethod,
																						booleanTypeFeat | arrayFirstElemNameNoIndexFeat | (matrixTypeI == 1 ? UniformCase::FEATURE_MATRIXMODE_ROWMAJOR : 0)));
								}
							}
						}
					}
				}
			}
		}
	}

	// Cases that assign multiple basic-array elements with one glProgramUniform*v() (i.e. the count parameter is bigger than 1).

	{
		static const struct
		{
			UniformCase::Feature	arrayAssignMode;
			const char*				name;
			const char*				description;
		} arrayAssignGroups[] =
		{
			{ UniformCase::FEATURE_ARRAYASSIGN_FULL,			"basic_array_assign_full",		"Assign entire basic-type arrays per glProgramUniform*v() call"				},
			{ UniformCase::FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO,	"basic_array_assign_partial",	"Assign two elements of a basic-type array per glProgramUniform*v() call"	}
		};

		for (int arrayAssignGroupNdx = 0; arrayAssignGroupNdx < DE_LENGTH_OF_ARRAY(arrayAssignGroups); arrayAssignGroupNdx++)
		{
			UniformCase::Feature	arrayAssignMode		= arrayAssignGroups[arrayAssignGroupNdx].arrayAssignMode;
			const char* const		groupName			= arrayAssignGroups[arrayAssignGroupNdx].name;
			const char* const		groupDesc			= arrayAssignGroups[arrayAssignGroupNdx].description;

			TestCaseGroup* const curArrayAssignGroup = new TestCaseGroup(m_context, groupName, groupDesc);
			addChild(curArrayAssignGroup);

			static const int basicArrayCollectionGroups[] = { UNIFORMCOLLECTIONS_BASIC_ARRAY, UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT, UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY };

			for (int collectionGroupNdx = 0; collectionGroupNdx < DE_LENGTH_OF_ARRAY(basicArrayCollectionGroups); collectionGroupNdx++)
			{
				const UniformCollectionGroup&	collectionGroup		= defaultUniformCollections[basicArrayCollectionGroups[collectionGroupNdx]];
				TestCaseGroup* const			collectionTestGroup	= new TestCaseGroup(m_context, collectionGroup.name.c_str(), "");
				curArrayAssignGroup->addChild(collectionTestGroup);

				for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
				{
					const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
					const string								collName			= collectionCase.namePrefix;
					const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

					for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
					{
						const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
						collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																			UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																			arrayAssignMode));
					}
				}
			}
		}
	}

	// Cases with unused uniforms.

	{
		TestCaseGroup* const unusedUniformsGroup = new TestCaseGroup(m_context, "unused_uniforms", "Test with unused uniforms");
		addChild(unusedUniformsGroup);

		const UniformCollectionGroup& collectionGroup = defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT];

		for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
		{
			const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
			const string								collName			= collectionCase.namePrefix;
			const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

			for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
			{
				const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
				unusedUniformsGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																	UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																	UniformCase::FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX | UniformCase::FEATURE_UNIFORMUSAGE_EVERY_OTHER));
			}
		}
	}
}